

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

void Sbl_ManUpdateMapping(Sbl_Man_t *p)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Gia_Man_t *pGVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  
  pVVar12 = p->vSolBest;
  iVar13 = pVVar12->nSize;
  if (p->vSolInit->nSize <= iVar13) {
    __assert_fail("Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                  ,0x218,"void Sbl_ManUpdateMapping(Sbl_Man_t *)");
  }
  pVVar2 = p->vAnds;
  if (0 < pVVar2->nSize) {
    piVar3 = pVVar2->pArray;
    pGVar4 = p->pGia;
    pVVar5 = pGVar4->vMapping2;
    lVar14 = 0;
    do {
      lVar15 = (long)piVar3[lVar14];
      if ((lVar15 < 0) || (pVVar5->nSize <= piVar3[lVar14])) goto LAB_00754640;
      pVVar6 = pVVar5->pArray;
      if (0 < pVVar6[lVar15].nSize) {
        piVar7 = pGVar4->pLutRefs;
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x235,"int Gia_ObjLutRefDecId(Gia_Man_t *, int)");
        }
        piVar8 = pVVar6[lVar15].pArray;
        lVar17 = 0;
        do {
          piVar1 = piVar7 + piVar8[lVar17];
          *piVar1 = *piVar1 + -1;
          lVar17 = lVar17 + 1;
        } while (lVar17 < pVVar6[lVar15].nSize);
      }
      pVVar6[lVar15].nSize = 0;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar2->nSize);
    iVar13 = pVVar12->nSize;
  }
  if (0 < iVar13) {
    lVar14 = 0;
    do {
      iVar13 = pVVar12->pArray[lVar14];
      lVar15 = (long)iVar13;
      if ((((lVar15 < 0) || (p->vCutsI1->nSize <= iVar13)) || (p->vCutsI2->nSize <= iVar13)) ||
         ((p->vCutsN1->nSize <= iVar13 || (p->vCutsN2->nSize <= iVar13)))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (p->vCutsObj->nSize <= iVar13) {
LAB_00754602:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar13 = p->vCutsObj->pArray[lVar15];
      if (((long)iVar13 < 0) || (p->vAnds->nSize <= iVar13)) goto LAB_00754602;
      iVar13 = p->vAnds->pArray[iVar13];
      lVar17 = (long)iVar13;
      if ((lVar17 < 0) || (pVVar5 = p->pGia->vMapping2, pVVar5->nSize <= iVar13)) {
LAB_00754640:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      uVar18 = p->vCutsI1->pArray[lVar15];
      uVar9 = p->vCutsI2->pArray[lVar15];
      uVar10 = p->vCutsN1->pArray[lVar15];
      uVar11 = p->vCutsN2->pArray[lVar15];
      pVVar2 = pVVar5->pArray;
      pVVar12 = pVVar2 + lVar17;
      pVVar2[lVar17].nSize = 0;
      uVar16 = 0;
      do {
        if ((uVar18 >> (uVar16 & 0x3f) & 1) != 0) {
          if ((long)p->vLeaves->nSize <= (long)uVar16) goto LAB_00754602;
          Vec_IntPush(pVVar12,p->vLeaves->pArray[uVar16]);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x40);
      uVar18 = 0;
      do {
        if ((uVar9 >> (uVar18 & 0x3f) & 1) != 0) {
          if ((long)p->vLeaves->nSize <= (long)(uVar18 + 0x40)) goto LAB_00754602;
          Vec_IntPush(pVVar12,p->vLeaves->pArray[uVar18 + 0x40]);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 0x40);
      uVar18 = 0;
      do {
        if ((uVar10 >> (uVar18 & 0x3f) & 1) != 0) {
          if ((long)p->vAnds->nSize <= (long)uVar18) goto LAB_00754602;
          Vec_IntPush(pVVar12,p->vAnds->pArray[uVar18]);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 0x40);
      uVar18 = 0;
      do {
        if ((uVar11 >> (uVar18 & 0x3f) & 1) != 0) {
          if ((long)p->vAnds->nSize <= (long)(uVar18 + 0x40)) goto LAB_00754602;
          Vec_IntPush(pVVar12,p->vAnds->pArray[uVar18 + 0x40]);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 0x40);
      if (0 < pVVar12->nSize) {
        piVar3 = p->pGia->pLutRefs;
        if (piVar3 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x234,"int Gia_ObjLutRefIncId(Gia_Man_t *, int)");
        }
        piVar7 = pVVar12->pArray;
        lVar15 = 0;
        do {
          piVar8 = piVar3 + piVar7[lVar15];
          *piVar8 = *piVar8 + 1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar12->nSize);
      }
      lVar14 = lVar14 + 1;
      pVVar12 = p->vSolBest;
    } while (lVar14 < pVVar12->nSize);
  }
  return;
}

Assistant:

void Sbl_ManUpdateMapping( Sbl_Man_t * p )
{
//    Gia_Obj_t * pObj;
    Vec_Int_t * vObj;
    word CutI1, CutI2, CutN1, CutN2;
    int i, c, b, iObj, iTemp; 
    assert( Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
    {
        vObj = Vec_WecEntry(p->pGia->vMapping2, iObj);
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefDecId( p->pGia, iTemp );
        Vec_IntClear( vObj );
    }
    Vec_IntForEachEntry( p->vSolBest, c, i )
    {
        CutI1 = Vec_WrdEntry( p->vCutsI1, c );
        CutI2 = Vec_WrdEntry( p->vCutsI2, c );
        CutN1 = Vec_WrdEntry( p->vCutsN1, c );
        CutN2 = Vec_WrdEntry( p->vCutsN2, c );
        iObj = Vec_IntEntry( p->vCutsObj, c );
        iObj = Vec_IntEntry( p->vAnds, iObj );
        vObj = Vec_WecEntry( p->pGia->vMapping2, iObj );
        Vec_IntClear( vObj );
        assert( Vec_IntSize(vObj) == 0 );
        for ( b = 0; b < 64; b++ )
            if ( (CutI1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutI2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, 64+b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, 64+b) );
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefIncId( p->pGia, iTemp );
    }
/*
    // verify
    Gia_ManForEachLut2Vec( p->pGia, vObj, i )
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefDecId( p->pGia, iTemp );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjLutRefDecId( p->pGia, Gia_ObjFaninId0p(p->pGia, pObj) );

    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
        if ( p->pGia->pLutRefs[i] )
            printf( "Object %d has %d refs\n", i, p->pGia->pLutRefs[i] );

    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjLutRefIncId( p->pGia, Gia_ObjFaninId0p(p->pGia, pObj) );
    Gia_ManForEachLut2Vec( p->pGia, vObj, i )
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefIncId( p->pGia, iTemp );
*/
}